

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim3.c
# Opt level: O1

void Txs3_ManCollectCone(Txs3_Man_t *p,int fVerbose)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  Gia_Man_t *pGVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  
  p->vCiObjs->nSize = 0;
  p->vFosPre->nSize = 0;
  p->vFosAbs->nSize = 0;
  p->vNodes->nSize = 0;
  p->pGia->pObjs->Value = 0xffffffff;
  pVVar6 = p->vCoObjs;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      iVar1 = pVVar6->pArray[lVar11];
      if (((long)iVar1 < 0) || (p->pGia->nObjs <= iVar1)) goto LAB_005f38a6;
      pGVar3 = p->pGia->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar3 = pGVar3 + iVar1;
      Txs3_ManCollectCone_rec(p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
      lVar11 = lVar11 + 1;
      pVVar6 = p->vCoObjs;
    } while (lVar11 < pVVar6->nSize);
  }
  if (fVerbose != 0) {
    printf("%d %d %d \n",(ulong)(uint)p->vCiObjs->nSize,(ulong)(uint)p->vFosPre->nSize,
           (ulong)(uint)p->vFosAbs->nSize);
  }
  iVar1 = p->vCiObjs->nSize;
  p->nPiLits = iVar1;
  if (1 < (long)iVar1) {
    piVar4 = p->vCiObjs->pArray;
    lVar11 = 1;
    uVar7 = 0;
    do {
      uVar10 = uVar7 & 0xffffffff;
      lVar8 = lVar11;
      do {
        uVar9 = (uint)lVar8;
        if (piVar4[(int)(uint)uVar10] <= piVar4[lVar8]) {
          uVar9 = (uint)uVar10;
        }
        lVar8 = lVar8 + 1;
        uVar10 = (ulong)uVar9;
      } while (iVar1 != lVar8);
      iVar2 = piVar4[uVar7];
      piVar4[uVar7] = piVar4[(int)uVar9];
      uVar7 = uVar7 + 1;
      piVar4[(int)uVar9] = iVar2;
      lVar11 = lVar11 + 1;
    } while (uVar7 != iVar1 - 1);
  }
  iVar1 = p->vFosPre->nSize;
  if (1 < (long)iVar1) {
    piVar4 = p->vFosPre->pArray;
    lVar11 = 1;
    uVar7 = 0;
    do {
      uVar10 = uVar7 & 0xffffffff;
      lVar8 = lVar11;
      do {
        uVar9 = (uint)lVar8;
        if (piVar4[lVar8] <= piVar4[(int)(uint)uVar10]) {
          uVar9 = (uint)uVar10;
        }
        lVar8 = lVar8 + 1;
        uVar10 = (ulong)uVar9;
      } while (iVar1 != lVar8);
      iVar2 = piVar4[uVar7];
      piVar4[uVar7] = piVar4[(int)uVar9];
      uVar7 = uVar7 + 1;
      piVar4[(int)uVar9] = iVar2;
      lVar11 = lVar11 + 1;
    } while (uVar7 != iVar1 - 1);
  }
  pVVar6 = p->vFosPre;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      Vec_IntPush(p->vCiObjs,pVVar6->pArray[lVar11]);
      lVar11 = lVar11 + 1;
      pVVar6 = p->vFosPre;
    } while (lVar11 < pVVar6->nSize);
  }
  iVar1 = p->vFosAbs->nSize;
  if (1 < (long)iVar1) {
    piVar4 = p->vFosAbs->pArray;
    lVar11 = 1;
    uVar7 = 0;
    do {
      uVar10 = uVar7 & 0xffffffff;
      lVar8 = lVar11;
      do {
        uVar9 = (uint)lVar8;
        if (piVar4[lVar8] <= piVar4[(int)(uint)uVar10]) {
          uVar9 = (uint)uVar10;
        }
        lVar8 = lVar8 + 1;
        uVar10 = (ulong)uVar9;
      } while (iVar1 != lVar8);
      iVar2 = piVar4[uVar7];
      piVar4[uVar7] = piVar4[(int)uVar9];
      uVar7 = uVar7 + 1;
      piVar4[(int)uVar9] = iVar2;
      lVar11 = lVar11 + 1;
    } while (uVar7 != iVar1 - 1);
  }
  pVVar6 = p->vFosAbs;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      Vec_IntPush(p->vCiObjs,pVVar6->pArray[lVar11]);
      lVar11 = lVar11 + 1;
      pVVar6 = p->vFosAbs;
    } while (lVar11 < pVVar6->nSize);
  }
  lVar11 = (long)p->vCiObjs->nSize;
  if (0 < lVar11) {
    pGVar5 = p->pGia;
    piVar4 = p->vCiObjs->pArray;
    lVar8 = 0;
    do {
      iVar1 = piVar4[lVar8];
      if (((long)iVar1 < 0) || (pGVar5->nObjs <= iVar1)) goto LAB_005f38a6;
      pGVar3 = pGVar5->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar3[iVar1].Value = 0;
      lVar8 = lVar8 + 1;
    } while (lVar11 != lVar8);
  }
  lVar11 = (long)p->vNodes->nSize;
  if (0 < lVar11) {
    pGVar5 = p->pGia;
    piVar4 = p->vNodes->pArray;
    lVar8 = 0;
    do {
      iVar1 = piVar4[lVar8];
      if (((long)iVar1 < 0) || (pGVar5->nObjs <= iVar1)) {
LAB_005f38a6:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = pGVar5->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar3[iVar1].Value = 0;
      lVar8 = lVar8 + 1;
    } while (lVar11 != lVar8);
  }
  return;
}

Assistant:

void Txs3_ManCollectCone( Txs3_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj; int i, Entry;
//    printf( "Collecting cones for clause with %d literals.\n", Vec_IntSize(vCoObjs) );
    Vec_IntClear( p->vCiObjs );
    Vec_IntClear( p->vFosPre );
    Vec_IntClear( p->vFosAbs );
    Vec_IntClear( p->vNodes );
    Gia_ManConst0(p->pGia)->Value = ~0;
    Gia_ManForEachObjVec( p->vCoObjs, p->pGia, pObj, i )
        Txs3_ManCollectCone_rec( p, Gia_ObjFanin0(pObj) );
if ( fVerbose )
printf( "%d %d %d \n", Vec_IntSize(p->vCiObjs), Vec_IntSize(p->vFosPre), Vec_IntSize(p->vFosAbs) );
    p->nPiLits = Vec_IntSize(p->vCiObjs);
    // sort primary inputs
    Vec_IntSelectSort( Vec_IntArray(p->vCiObjs), Vec_IntSize(p->vCiObjs) );
    // sort and add present flop variables
    Vec_IntSelectSortReverse( Vec_IntArray(p->vFosPre), Vec_IntSize(p->vFosPre) );
    Vec_IntForEachEntry( p->vFosPre, Entry, i )
        Vec_IntPush( p->vCiObjs, Entry );
    // sort and add absent flop variables
    Vec_IntSelectSortReverse( Vec_IntArray(p->vFosAbs), Vec_IntSize(p->vFosAbs) );
    Vec_IntForEachEntry( p->vFosAbs, Entry, i )
        Vec_IntPush( p->vCiObjs, Entry );
    // cleanup
    Gia_ManForEachObjVec( p->vCiObjs, p->pGia, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachObjVec( p->vNodes, p->pGia, pObj, i )
        pObj->Value = 0;
}